

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  char *pcVar1;
  ostream *poVar2;
  allocator local_221;
  string local_220 [39];
  allocator local_1f9;
  string local_1f8 [39];
  allocator local_1d1;
  string local_1d0 [39];
  allocator local_1a9;
  string local_1a8 [48];
  char local_178 [8];
  char check_fold [100];
  char input_lable;
  M_tree mtree_head;
  char **argv_local;
  int argc_local;
  
  mtree_head._240_8_ = argv;
  if ((argc == 1) || (3 < argc)) {
    puts("error parameters");
  }
  else {
    M_tree::M_tree((M_tree *)(check_fold + 0x60));
    do {
      poVar2 = std::operator<<((ostream *)&std::cout,"1. Building the M_tree.");
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      poVar2 = std::operator<<((ostream *)&std::cout,"2. Updating the M_tree.");
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      poVar2 = std::operator<<((ostream *)&std::cout,
                               "3. Checking the difference between two folder.");
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      poVar2 = std::operator<<((ostream *)&std::cout,"Please input 1~3 to using these function!");
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      std::operator>>((istream *)&std::cin,check_fold + 0x5f);
      if (check_fold[0x5f] == '1') {
        poVar2 = std::operator<<((ostream *)&std::cout,
                                 "**************** We are building the Merkle tree. Please wait... ****************"
                                );
        std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
        pcVar1 = *(char **)(mtree_head._240_8_ + 8);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_1a8,pcVar1,&local_1a9);
        std::__cxx11::string::operator=
                  ((string *)
                   &mtree_head.point_of.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage,local_1a8);
        std::__cxx11::string::~string(local_1a8);
        std::allocator<char>::~allocator((allocator<char> *)&local_1a9);
        M_tree::build((M_tree *)(check_fold + 0x60),*(char **)(mtree_head._240_8_ + 8),1);
        M_tree::show((M_tree *)(check_fold + 0x60),1,1);
      }
      else if (check_fold[0x5f] == '2') {
        poVar2 = std::operator<<((ostream *)&std::cout,
                                 "**************** We are updating the Merkle tree. Please wait... ****************"
                                );
        std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
        M_tree::update((M_tree *)(check_fold + 0x60));
        M_tree::show((M_tree *)(check_fold + 0x60),1,2);
      }
      else if (check_fold[0x5f] == '3') {
        M_tree::build((M_tree *)(check_fold + 0x60),*(char **)(mtree_head._240_8_ + 8),1);
        pcVar1 = *(char **)(mtree_head._240_8_ + 8);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_1d0,pcVar1,&local_1d1);
        std::__cxx11::string::operator=
                  ((string *)
                   &mtree_head.point_of.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage,local_1d0);
        std::__cxx11::string::~string(local_1d0);
        std::allocator<char>::~allocator((allocator<char> *)&local_1d1);
        if (argc == 2) {
          poVar2 = std::operator<<((ostream *)&std::cout,
                                   "Please input the address, we will check their difference.");
          std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
          std::operator>>((basic_istream<char,_std::char_traits<char>_> *)&std::cin,local_178);
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_1f8,local_178,&local_1f9);
          std::__cxx11::string::operator=((string *)&mtree_head.field_0xd0,local_1f8);
          std::__cxx11::string::~string(local_1f8);
          std::allocator<char>::~allocator((allocator<char> *)&local_1f9);
          M_tree::build((M_tree *)(check_fold + 0x60),local_178,3);
        }
        else {
          pcVar1 = *(char **)(mtree_head._240_8_ + 0x10);
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_220,pcVar1,&local_221);
          std::__cxx11::string::operator=((string *)&mtree_head.field_0xd0,local_220);
          std::__cxx11::string::~string(local_220);
          std::allocator<char>::~allocator((allocator<char> *)&local_221);
          M_tree::build((M_tree *)(check_fold + 0x60),*(char **)(mtree_head._240_8_ + 0x10),3);
        }
        poVar2 = std::operator<<((ostream *)&std::cout,
                                 "**************** We are checking the difference. Please wait... ****************"
                                );
        std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
        M_tree::compare((M_tree *)(check_fold + 0x60));
      }
      else if (check_fold[0x5f] == 'q') {
        poVar2 = std::operator<<((ostream *)&std::cout,"Thanks for your using. Good bye~");
        std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      }
      else {
        poVar2 = std::operator<<((ostream *)&std::cout,
                                 "You inputed a wrong alphabet, Please input again.");
        std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      }
      std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
    } while (check_fold[0x5f] != 'q');
    M_tree::~M_tree((M_tree *)(check_fold + 0x60));
  }
  return 0;
}

Assistant:

int main(int argc, char *argv[]) {
    if(argc == 1 || argc > 3) {
        puts("error parameters");
        return 0;
    }

    //含程序自身参数，总参数数为2时，第2个参数为用于构建默克尔树的目录
    //含程序自身参数，总参数数为3时，第2个参数为用于构建默克尔树的目录，第3个参数为用于构建默克尔树和比较一致性的目录，
    //相关逻辑自行补充

    M_tree mtree_head;
    char input_lable;
    char check_fold[100];

    while(1) //整体实验大循环，完成实验3-1至3-4
    {
        //初始化创建叶子节点，注意根据目录下文件数分配空间
        //initalize_leaf函数，输出Node类型的数组，每个叶子节点的key可使用文件名，哈希值为文件所有数据的哈希，叶子节点初始化时，父节点、左右子节点为空，数据结构参考前述数据结构。未初始化时，key值可以设成-1.
        //hash函数可以是MD5，也可以是SHA-256，或自行设计哈希函数
        cout << "1. Building the M_tree." << endl;
        cout << "2. Updating the M_tree." << endl;
        cout << "3. Checking the difference between two folder." << endl;
        cout << "Please input 1~3 to using these function!" << endl;
        cin >> input_lable;
        switch(input_lable){
            case '1':
            {
                cout << "**************** We are building the Merkle tree. Please wait... ****************" << endl;
                mtree_head.folder_name1 = string(argv[1]);
                mtree_head.build(argv[1], 1);
                mtree_head.show(1, 1);
                break;
            }
            case '2':
            {
                cout << "**************** We are updating the Merkle tree. Please wait... ****************" << endl;
                mtree_head.update();
                mtree_head.show(1, 2);
                break;
            }
            case '3':
            {
                mtree_head.build(argv[1], 1);
                mtree_head.folder_name1 = string(argv[1]);
                if(argc == 2){
                    cout << "Please input the address, we will check their difference." << endl;
                    cin >> check_fold;
                    mtree_head.folder_name2 = string(check_fold);
                    mtree_head.build(check_fold, 3);
                }
                else{
                    mtree_head.folder_name2 = string(argv[2]);
                    mtree_head.build(argv[2], 3);
                }
                cout << "**************** We are checking the difference. Please wait... ****************" << endl;
                mtree_head.compare();
                break;
            }
            case 'q':
            {
                cout << "Thanks for your using. Good bye~" << endl;
                break;
            }
            default:{
                cout << "You inputed a wrong alphabet, Please input again." << endl;
            }
        }
        cout << endl;
        if(input_lable == 'q'){
            break;
        }
    }//结束大循环
}